

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<llvm::SMFixIt>::append<llvm::SMFixIt_const*,void>
          (SmallVectorImpl<llvm::SMFixIt> *this,SMFixIt *in_start,SMFixIt *in_end)

{
  void *pvVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_type NumInputs;
  SMFixIt *in_end_local;
  SMFixIt *in_start_local;
  SmallVectorImpl<llvm::SMFixIt> *this_local;
  
  uVar2 = std::distance<llvm::SMFixIt_const*>(in_start,in_end);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  sVar4 = SmallVectorBase::size((SmallVectorBase *)this);
  if (sVar3 - sVar4 < uVar2) {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorTemplateBase<llvm::SMFixIt,_false>::grow
              (&this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>,sVar3 + uVar2);
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
           super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorTemplateBase<llvm::SMFixIt,false>::
  uninitialized_copy<llvm::SMFixIt_const*,llvm::SMFixIt*>
            (in_start,in_end,(SMFixIt *)((long)pvVar1 + sVar3 * 0x30));
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar3 + uVar2);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }